

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O3

double __thiscall Assimp::StreamReader<false,_false>::Get<double>(StreamReader<false,_false> *this)

{
  double *pdVar1;
  double dVar2;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pdVar1 = (double *)((long)this->current + 8);
  if (pdVar1 <= this->limit) {
    dVar2 = *(double *)this->current;
    this->current = (int8_t *)pdVar1;
    return dVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"End of file or stream limit was reached","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }